

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O1

void compute_padded_integral_img_int(uint8_t *gray_image,integral_image *iimage)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  byte bVar22;
  uint uVar23;
  float *pfVar24;
  int i;
  float fVar25;
  long lVar26;
  float *pfVar27;
  int i_1;
  uint8_t *puVar28;
  int iVar29;
  float *pfVar30;
  ulong uVar31;
  float *pfVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  ushort uVar38;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  
  pfVar27 = iimage->padded_data;
  uVar1 = iimage->height;
  uVar2 = iimage->data_width;
  lVar35 = (long)(int)uVar2;
  iVar3 = iimage->data_height;
  uVar4 = iimage->width;
  iVar34 = uVar2 - uVar4;
  uVar23 = iVar34 / 2;
  uVar36 = (ulong)uVar23;
  if (1 < iVar34) {
    uVar31 = 0;
    do {
      if (0 < (int)uVar2) {
        memset(pfVar27 + uVar31,0,(ulong)uVar2 * 4);
      }
      uVar31 = (ulong)((int)uVar31 + uVar2);
      uVar36 = uVar36 - 1;
    } while (uVar36 != 0);
  }
  if ((int)uVar23 < iVar3) {
    iVar29 = iVar3 - uVar23;
    iVar37 = uVar2 * uVar23;
    do {
      if (1 < iVar34) {
        memset(pfVar27 + iVar37,0,(ulong)(uVar23 - 1) * 4 + 4);
      }
      iVar37 = iVar37 + uVar2;
      iVar29 = iVar29 + -1;
    } while (iVar29 != 0);
  }
  pfVar24 = iimage->data;
  if (0 < (int)uVar4) {
    uVar36 = 0;
    fVar25 = 0.0;
    do {
      fVar25 = (float)((int)fVar25 + (uint)gray_image[uVar36]);
      pfVar24[uVar36] = fVar25;
      uVar36 = uVar36 + 1;
    } while (uVar4 != uVar36);
  }
  if (1 < (int)uVar1) {
    puVar28 = gray_image + (int)uVar4;
    uVar36 = 1;
    pfVar30 = pfVar24;
    pfVar32 = pfVar24;
    do {
      pfVar32 = pfVar32 + lVar35;
      if (0 < (int)uVar4) {
        uVar31 = 0;
        iVar34 = 0;
        do {
          iVar34 = iVar34 + (uint)puVar28[uVar31];
          pfVar32[uVar31] = (float)((int)pfVar30[uVar31] + iVar34);
          uVar31 = uVar31 + 1;
        } while (uVar4 != uVar31);
      }
      uVar36 = uVar36 + 1;
      pfVar30 = pfVar30 + lVar35;
      puVar28 = puVar28 + (int)uVar4;
    } while (uVar36 != uVar1);
  }
  if (0 < (int)uVar1) {
    auVar39 = vpbroadcastq_avx512f();
    uVar36 = 0;
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar42 = vbroadcastss_avx512f(ZEXT416(0x3b808081));
    do {
      if (0 < (int)uVar4) {
        uVar31 = 0;
        do {
          auVar43 = vpbroadcastq_avx512f();
          auVar44 = vporq_avx512f(auVar43,auVar40);
          auVar43 = vporq_avx512f(auVar43,auVar41);
          uVar19 = vpcmpuq_avx512f(auVar43,auVar39,2);
          bVar21 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar44,auVar39,2);
          bVar22 = (byte)uVar19;
          uVar38 = CONCAT11(bVar22,bVar21);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pfVar24 + uVar31));
          auVar44._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar43._4_4_;
          auVar44._0_4_ = (uint)(bVar21 & 1) * auVar43._0_4_;
          auVar44._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar43._8_4_;
          auVar44._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar43._12_4_;
          auVar44._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar43._16_4_;
          auVar44._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar43._20_4_;
          auVar44._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar43._24_4_;
          auVar44._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar43._28_4_;
          auVar44._32_4_ = (uint)(bVar22 & 1) * auVar43._32_4_;
          auVar44._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar43._36_4_;
          auVar44._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar43._40_4_;
          auVar44._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar43._44_4_;
          auVar44._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar43._48_4_;
          auVar44._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar43._52_4_;
          auVar44._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar43._56_4_;
          auVar44._60_4_ = (uint)(bVar22 >> 7) * auVar43._60_4_;
          auVar43 = vcvtudq2ps_avx512f(auVar44);
          auVar43 = vmulps_avx512f(auVar43,auVar42);
          pfVar32 = pfVar24 + uVar31;
          bVar5 = (bool)((byte)(uVar38 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar38 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar38 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar38 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar38 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar38 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar38 >> 7) & 1);
          bVar12 = (bool)(bVar22 >> 1 & 1);
          bVar13 = (bool)(bVar22 >> 2 & 1);
          bVar14 = (bool)(bVar22 >> 3 & 1);
          bVar15 = (bool)(bVar22 >> 4 & 1);
          bVar16 = (bool)(bVar22 >> 5 & 1);
          bVar17 = (bool)(bVar22 >> 6 & 1);
          *pfVar32 = (float)((uint)(bVar21 & 1) * auVar43._0_4_ |
                            (uint)!(bool)(bVar21 & 1) * (int)*pfVar32);
          pfVar32[1] = (float)((uint)bVar5 * auVar43._4_4_ | (uint)!bVar5 * (int)pfVar32[1]);
          pfVar32[2] = (float)((uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * (int)pfVar32[2]);
          pfVar32[3] = (float)((uint)bVar7 * auVar43._12_4_ | (uint)!bVar7 * (int)pfVar32[3]);
          pfVar32[4] = (float)((uint)bVar8 * auVar43._16_4_ | (uint)!bVar8 * (int)pfVar32[4]);
          pfVar32[5] = (float)((uint)bVar9 * auVar43._20_4_ | (uint)!bVar9 * (int)pfVar32[5]);
          pfVar32[6] = (float)((uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * (int)pfVar32[6]);
          pfVar32[7] = (float)((uint)bVar11 * auVar43._28_4_ | (uint)!bVar11 * (int)pfVar32[7]);
          pfVar32[8] = (float)((uint)(bVar22 & 1) * auVar43._32_4_ |
                              (uint)!(bool)(bVar22 & 1) * (int)pfVar32[8]);
          pfVar32[9] = (float)((uint)bVar12 * auVar43._36_4_ | (uint)!bVar12 * (int)pfVar32[9]);
          pfVar32[10] = (float)((uint)bVar13 * auVar43._40_4_ | (uint)!bVar13 * (int)pfVar32[10]);
          pfVar32[0xb] = (float)((uint)bVar14 * auVar43._44_4_ | (uint)!bVar14 * (int)pfVar32[0xb]);
          pfVar32[0xc] = (float)((uint)bVar15 * auVar43._48_4_ | (uint)!bVar15 * (int)pfVar32[0xc]);
          pfVar32[0xd] = (float)((uint)bVar16 * auVar43._52_4_ | (uint)!bVar16 * (int)pfVar32[0xd]);
          pfVar32[0xe] = (float)((uint)bVar17 * auVar43._56_4_ | (uint)!bVar17 * (int)pfVar32[0xe]);
          pfVar32[0xf] = (float)((uint)(bVar22 >> 7) * auVar43._60_4_ |
                                (uint)!(bool)(bVar22 >> 7) * (int)pfVar32[0xf]);
          uVar31 = uVar31 + 0x10;
        } while ((uVar4 + 0xf & 0xfffffff0) != uVar31);
      }
      uVar36 = uVar36 + 1;
      pfVar24 = pfVar24 + lVar35;
    } while (uVar36 != uVar1);
  }
  iVar34 = uVar23 + uVar1;
  if (0 < (int)uVar1) {
    iVar29 = uVar23 + uVar4;
    lVar26 = (long)(int)uVar23;
    auVar39 = vpbroadcastq_avx512f();
    pfVar24 = pfVar27 + lVar35 * lVar26 + (long)iVar29;
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      if (iVar29 < (int)uVar2) {
        auVar42 = vbroadcastss_avx512f
                            (ZEXT416((uint)pfVar27[(long)(int)((int)lVar26 * uVar2 + iVar29) + -1]))
        ;
        uVar36 = 0;
        do {
          auVar43 = vpbroadcastq_avx512f();
          auVar44 = vporq_avx512f(auVar43,auVar40);
          auVar43 = vporq_avx512f(auVar43,auVar41);
          uVar19 = vpcmpuq_avx512f(auVar43,auVar39,2);
          uVar20 = vpcmpuq_avx512f(auVar44,auVar39,2);
          bVar21 = (byte)uVar20;
          uVar38 = CONCAT11(bVar21,(byte)uVar19);
          pfVar32 = pfVar24 + uVar36;
          bVar5 = (bool)((byte)uVar19 & 1);
          bVar6 = (bool)((byte)(uVar38 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar38 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar38 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar38 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar38 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar38 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar38 >> 7) & 1);
          bVar13 = (bool)(bVar21 >> 1 & 1);
          bVar14 = (bool)(bVar21 >> 2 & 1);
          bVar15 = (bool)(bVar21 >> 3 & 1);
          bVar16 = (bool)(bVar21 >> 4 & 1);
          bVar17 = (bool)(bVar21 >> 5 & 1);
          bVar18 = (bool)(bVar21 >> 6 & 1);
          *pfVar32 = (float)((uint)bVar5 * auVar42._0_4_ | (uint)!bVar5 * (int)*pfVar32);
          pfVar32[1] = (float)((uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * (int)pfVar32[1]);
          pfVar32[2] = (float)((uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * (int)pfVar32[2]);
          pfVar32[3] = (float)((uint)bVar8 * auVar42._12_4_ | (uint)!bVar8 * (int)pfVar32[3]);
          pfVar32[4] = (float)((uint)bVar9 * auVar42._16_4_ | (uint)!bVar9 * (int)pfVar32[4]);
          pfVar32[5] = (float)((uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * (int)pfVar32[5]);
          pfVar32[6] = (float)((uint)bVar11 * auVar42._24_4_ | (uint)!bVar11 * (int)pfVar32[6]);
          pfVar32[7] = (float)((uint)bVar12 * auVar42._28_4_ | (uint)!bVar12 * (int)pfVar32[7]);
          pfVar32[8] = (float)((uint)(bVar21 & 1) * auVar42._32_4_ |
                              (uint)!(bool)(bVar21 & 1) * (int)pfVar32[8]);
          pfVar32[9] = (float)((uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * (int)pfVar32[9]);
          pfVar32[10] = (float)((uint)bVar14 * auVar42._40_4_ | (uint)!bVar14 * (int)pfVar32[10]);
          pfVar32[0xb] = (float)((uint)bVar15 * auVar42._44_4_ | (uint)!bVar15 * (int)pfVar32[0xb]);
          pfVar32[0xc] = (float)((uint)bVar16 * auVar42._48_4_ | (uint)!bVar16 * (int)pfVar32[0xc]);
          pfVar32[0xd] = (float)((uint)bVar17 * auVar42._52_4_ | (uint)!bVar17 * (int)pfVar32[0xd]);
          pfVar32[0xe] = (float)((uint)bVar18 * auVar42._56_4_ | (uint)!bVar18 * (int)pfVar32[0xe]);
          pfVar32[0xf] = (float)((uint)(bVar21 >> 7) * auVar42._60_4_ |
                                (uint)!(bool)(bVar21 >> 7) * (int)pfVar32[0xf]);
          uVar36 = uVar36 + 0x10;
        } while (((lVar35 - iVar29) + 0xfU & 0xfffffffffffffff0) != uVar36);
      }
      lVar26 = lVar26 + 1;
      pfVar24 = pfVar24 + lVar35;
    } while (lVar26 < iVar34);
  }
  if (iVar34 < iVar3) {
    lVar26 = (long)iVar34;
    pfVar24 = pfVar27 + lVar35 * lVar26;
    pfVar32 = pfVar27 + (lVar26 + -1) * lVar35;
    do {
      lVar33 = (long)(int)uVar23;
      if (0 < (int)uVar4) {
        do {
          pfVar24[lVar33] = pfVar32[lVar33];
          lVar33 = lVar33 + 1;
        } while (lVar33 < (int)(uVar4 + uVar23));
      }
      lVar26 = lVar26 + 1;
      pfVar24 = pfVar24 + lVar35;
      pfVar32 = pfVar32 + lVar35;
    } while (lVar26 < iVar3);
  }
  if (iVar34 < iVar3) {
    lVar26 = (long)iVar34;
    iVar29 = uVar23 + uVar4;
    auVar39 = vpbroadcastq_avx512f();
    auVar40 = vbroadcastss_avx512f
                        (ZEXT416((uint)pfVar27[(long)(int)((iVar34 + -1) * uVar2 + uVar23 + uVar4) +
                                               -1]));
    pfVar27 = pfVar27 + lVar35 * lVar26 + (long)iVar29;
    auVar41 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      if (iVar29 < (int)uVar2) {
        uVar36 = 0;
        do {
          auVar43 = vpbroadcastq_avx512f();
          auVar44 = vporq_avx512f(auVar43,auVar41);
          auVar43 = vporq_avx512f(auVar43,auVar42);
          uVar19 = vpcmpuq_avx512f(auVar43,auVar39,2);
          uVar20 = vpcmpuq_avx512f(auVar44,auVar39,2);
          bVar21 = (byte)uVar20;
          uVar38 = CONCAT11(bVar21,(byte)uVar19);
          pfVar24 = pfVar27 + uVar36;
          bVar5 = (bool)((byte)uVar19 & 1);
          bVar6 = (bool)((byte)(uVar38 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar38 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar38 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar38 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar38 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar38 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar38 >> 7) & 1);
          bVar13 = (bool)(bVar21 >> 1 & 1);
          bVar14 = (bool)(bVar21 >> 2 & 1);
          bVar15 = (bool)(bVar21 >> 3 & 1);
          bVar16 = (bool)(bVar21 >> 4 & 1);
          bVar17 = (bool)(bVar21 >> 5 & 1);
          bVar18 = (bool)(bVar21 >> 6 & 1);
          *pfVar24 = (float)((uint)bVar5 * auVar40._0_4_ | (uint)!bVar5 * (int)*pfVar24);
          pfVar24[1] = (float)((uint)bVar6 * auVar40._4_4_ | (uint)!bVar6 * (int)pfVar24[1]);
          pfVar24[2] = (float)((uint)bVar7 * auVar40._8_4_ | (uint)!bVar7 * (int)pfVar24[2]);
          pfVar24[3] = (float)((uint)bVar8 * auVar40._12_4_ | (uint)!bVar8 * (int)pfVar24[3]);
          pfVar24[4] = (float)((uint)bVar9 * auVar40._16_4_ | (uint)!bVar9 * (int)pfVar24[4]);
          pfVar24[5] = (float)((uint)bVar10 * auVar40._20_4_ | (uint)!bVar10 * (int)pfVar24[5]);
          pfVar24[6] = (float)((uint)bVar11 * auVar40._24_4_ | (uint)!bVar11 * (int)pfVar24[6]);
          pfVar24[7] = (float)((uint)bVar12 * auVar40._28_4_ | (uint)!bVar12 * (int)pfVar24[7]);
          pfVar24[8] = (float)((uint)(bVar21 & 1) * auVar40._32_4_ |
                              (uint)!(bool)(bVar21 & 1) * (int)pfVar24[8]);
          pfVar24[9] = (float)((uint)bVar13 * auVar40._36_4_ | (uint)!bVar13 * (int)pfVar24[9]);
          pfVar24[10] = (float)((uint)bVar14 * auVar40._40_4_ | (uint)!bVar14 * (int)pfVar24[10]);
          pfVar24[0xb] = (float)((uint)bVar15 * auVar40._44_4_ | (uint)!bVar15 * (int)pfVar24[0xb]);
          pfVar24[0xc] = (float)((uint)bVar16 * auVar40._48_4_ | (uint)!bVar16 * (int)pfVar24[0xc]);
          pfVar24[0xd] = (float)((uint)bVar17 * auVar40._52_4_ | (uint)!bVar17 * (int)pfVar24[0xd]);
          pfVar24[0xe] = (float)((uint)bVar18 * auVar40._56_4_ | (uint)!bVar18 * (int)pfVar24[0xe]);
          pfVar24[0xf] = (float)((uint)(bVar21 >> 7) * auVar40._60_4_ |
                                (uint)!(bool)(bVar21 >> 7) * (int)pfVar24[0xf]);
          uVar36 = uVar36 + 0x10;
        } while (((lVar35 - iVar29) + 0xfU & 0xfffffffffffffff0) != uVar36);
      }
      lVar26 = lVar26 + 1;
      pfVar27 = pfVar27 + lVar35;
    } while (lVar26 < iVar3);
  }
  return;
}

Assistant:

void compute_padded_integral_img_int(uint8_t *gray_image, struct integral_image *iimage) {

    float *iimage_padded_data = iimage->padded_data;
   
    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        for (int i = 0; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        for (int i = 0; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        uint32_t *iimage_idata = (uint32_t *) iimage->data;

        uint32_t row_sum = 0;

        /* sum up the first row */
        for (int i = 0; i < width; ++i) {
            /* previous rows are 0 */
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }

        /* sum all remaining rows*/
        for (int j = 1; j < height; ++j) {
            row_sum = 0;
            for (int i = 0; i < width; ++i) {
                row_sum += gray_image[j * width + i];
                /*add sum of current row until current idx to sum of all previous rows until current index */
                iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j - 1) * data_width + i];
            }
        }

        // Converting uint32_t to floats by casting them and multiplying with (1.0f/255.0f)
        float *iimage_data = iimage->data;
        for (int j = 0; j < height; ++j) {
            for (int i = 0; i < width; ++i) {
                //iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
                iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
                //iimage_data[j * data_width + i] = ((float) iimage_idata[j * data_width + i]) / 255.0f;
            }
        }
    
    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row = iimage_padded_data[j * data_width + border + width - 1]; // TODO: Check if this is correct
        for (int i = width + border; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row;
        }
    }

    // BLOCK D
    for (int j = border + height; j < data_height; ++j) {
        for (int i = border; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value = iimage_padded_data[index_last_element];
    for (int j = border + height; j < data_height; ++j) {
        for (int i = border + width; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value;
        }
    }

}